

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionNegativeCornerCaseHelper<signed_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::NegativeCornerCase
               (uint lhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  char cVar1;
  uint uVar2;
  div_t dVar3;
  char *in_RDX;
  int in_EDI;
  char minT;
  char maxT;
  uint tmp;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  char local_18;
  char local_17;
  char local_16;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_15;
  uint local_14;
  char *local_10;
  int local_8;
  
  local_10 = in_RDX;
  local_8 = in_EDI;
  cVar1 = ::SafeInt::operator_cast_to_signed_char
                    ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  SVar4.m_int = (char)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  dVar3 = division_negative_negateU<signed_char,_unsigned_int,_false>::div((int)cVar1,local_8);
  uVar2 = dVar3.quot;
  local_14 = uVar2;
  cVar1 = std::numeric_limits<signed_char>::max();
  if ((uint)(int)cVar1 < uVar2) {
    local_17 = std::numeric_limits<signed_char>::max();
    if (local_14 != (int)local_17 + 1U) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    local_18 = std::numeric_limits<signed_char>::min();
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffe7,&local_18);
    *local_10 = SVar4.m_int;
  }
  else {
    local_16 = ((byte)local_14 ^ 0xff) + 1;
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              (&local_15,&local_16);
    *local_10 = local_15.m_int;
  }
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }